

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O0

Result_conflict *
CoreML::validateRankExists(Result_conflict *__return_storage_ptr__,NeuralNetworkLayer *layer)

{
  int iVar1;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string err;
  
  err.super__Rb_tree_node_base._M_right = (_Base_ptr)layer;
  err._M_storage._M_storage = (uchar  [8])__return_storage_ptr__;
  iVar1 = Specification::NeuralNetworkLayer::inputtensor_size(layer);
  if ((iVar1 != 0) &&
     (iVar1 = Specification::NeuralNetworkLayer::outputtensor_size
                        ((NeuralNetworkLayer *)err.super__Rb_tree_node_base._M_right), iVar1 != 0))
  {
    Result::Result((Result *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  psVar2 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                     ((NeuralNetworkLayer *)err.super__Rb_tree_node_base._M_right);
  std::__cxx11::string::string((string *)&local_78,(string *)psVar2);
  std::operator+(&local_58,"Layer \'",&local_78);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58,"\' must have rank specified for its input and output.");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateRankExists(const Specification::NeuralNetworkLayer& layer) {
    
    if (layer.inputtensor_size() == 0 || layer.outputtensor_size() == 0) {
        std::string err = "Layer '" + std::string(layer.name()) + "' must have rank specified for its input and output.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return Result();
}